

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O0

void __thiscall
zmq::tcp_address_t::tcp_address_t(tcp_address_t *this,sockaddr *sa_,socklen_t sa_len_)

{
  uint in_EDX;
  short *in_RSI;
  undefined8 *in_RDI;
  
  *(undefined1 *)(in_RDI + 7) = 0;
  if (in_RSI == (short *)0x0 || in_EDX == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sa_ && sa_len_ > 0",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
            ,0x3d);
    fflush(_stderr);
    zmq_abort((char *)0x2ddb6d);
  }
  memset(in_RDI,0,0x1c);
  memset((void *)((long)in_RDI + 0x1c),0,0x1c);
  if ((*in_RSI == 2) && (0xf < in_EDX)) {
    *in_RDI = *(undefined8 *)in_RSI;
    in_RDI[1] = *(undefined8 *)(in_RSI + 4);
  }
  else if ((*in_RSI == 10) && (0x1b < in_EDX)) {
    *in_RDI = *(undefined8 *)in_RSI;
    in_RDI[1] = *(undefined8 *)(in_RSI + 4);
    in_RDI[2] = *(undefined8 *)(in_RSI + 8);
    *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(in_RSI + 0xc);
  }
  return;
}

Assistant:

zmq::tcp_address_t::tcp_address_t (const sockaddr *sa_, socklen_t sa_len_) :
    _has_src_addr (false)
{
    zmq_assert (sa_ && sa_len_ > 0);

    memset (&_address, 0, sizeof (_address));
    memset (&_source_address, 0, sizeof (_source_address));
    if (sa_->sa_family == AF_INET
        && sa_len_ >= static_cast<socklen_t> (sizeof (_address.ipv4)))
        memcpy (&_address.ipv4, sa_, sizeof (_address.ipv4));
    else if (sa_->sa_family == AF_INET6
             && sa_len_ >= static_cast<socklen_t> (sizeof (_address.ipv6)))
        memcpy (&_address.ipv6, sa_, sizeof (_address.ipv6));
}